

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t zeMemPutIpcHandle(ze_context_handle_t hContext,ze_ipc_mem_handle_t handle)

{
  ze_pfnMemPutIpcHandle_t p_Var1;
  ze_ipc_mem_handle_t zVar2;
  ze_pfnMemPutIpcHandle_t p_Var3;
  __pointer_type p_Var4;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  ze_pfnMemPutIpcHandle_t local_20;
  ze_pfnMemPutIpcHandle_t pfnPutIpcHandle;
  ze_context_handle_t hContext_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    pfnPutIpcHandle = (ze_pfnMemPutIpcHandle_t)hContext;
    p_Var4 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var3 = pfnPutIpcHandle;
    p_Var1 = (p_Var4->Mem).pfnPutIpcHandle;
    if (p_Var1 == (ze_pfnMemPutIpcHandle_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      local_20 = p_Var1;
      memcpy(&local_60,&handle,0x40);
      zVar2.data[8] = (undefined1)uStack_58;
      zVar2.data[9] = uStack_58._1_1_;
      zVar2.data[10] = uStack_58._2_1_;
      zVar2.data[0xb] = uStack_58._3_1_;
      zVar2.data[0xc] = uStack_58._4_1_;
      zVar2.data[0xd] = uStack_58._5_1_;
      zVar2.data[0xe] = uStack_58._6_1_;
      zVar2.data[0xf] = uStack_58._7_1_;
      zVar2.data[0] = (undefined1)local_60;
      zVar2.data[1] = local_60._1_1_;
      zVar2.data[2] = local_60._2_1_;
      zVar2.data[3] = local_60._3_1_;
      zVar2.data[4] = local_60._4_1_;
      zVar2.data[5] = local_60._5_1_;
      zVar2.data[6] = local_60._6_1_;
      zVar2.data[7] = local_60._7_1_;
      zVar2.data[0x10] = (undefined1)local_50;
      zVar2.data[0x11] = local_50._1_1_;
      zVar2.data[0x12] = local_50._2_1_;
      zVar2.data[0x13] = local_50._3_1_;
      zVar2.data[0x14] = local_50._4_1_;
      zVar2.data[0x15] = local_50._5_1_;
      zVar2.data[0x16] = local_50._6_1_;
      zVar2.data[0x17] = local_50._7_1_;
      zVar2.data[0x18] = (undefined1)uStack_48;
      zVar2.data[0x19] = uStack_48._1_1_;
      zVar2.data[0x1a] = uStack_48._2_1_;
      zVar2.data[0x1b] = uStack_48._3_1_;
      zVar2.data[0x1c] = uStack_48._4_1_;
      zVar2.data[0x1d] = uStack_48._5_1_;
      zVar2.data[0x1e] = uStack_48._6_1_;
      zVar2.data[0x1f] = uStack_48._7_1_;
      zVar2.data[0x20] = (undefined1)local_40;
      zVar2.data[0x21] = local_40._1_1_;
      zVar2.data[0x22] = local_40._2_1_;
      zVar2.data[0x23] = local_40._3_1_;
      zVar2.data[0x24] = local_40._4_1_;
      zVar2.data[0x25] = local_40._5_1_;
      zVar2.data[0x26] = local_40._6_1_;
      zVar2.data[0x27] = local_40._7_1_;
      zVar2.data[0x28] = (undefined1)uStack_38;
      zVar2.data[0x29] = uStack_38._1_1_;
      zVar2.data[0x2a] = uStack_38._2_1_;
      zVar2.data[0x2b] = uStack_38._3_1_;
      zVar2.data[0x2c] = uStack_38._4_1_;
      zVar2.data[0x2d] = uStack_38._5_1_;
      zVar2.data[0x2e] = uStack_38._6_1_;
      zVar2.data[0x2f] = uStack_38._7_1_;
      zVar2.data[0x30] = (undefined1)local_30;
      zVar2.data[0x31] = local_30._1_1_;
      zVar2.data[0x32] = local_30._2_1_;
      zVar2.data[0x33] = local_30._3_1_;
      zVar2.data[0x34] = local_30._4_1_;
      zVar2.data[0x35] = local_30._5_1_;
      zVar2.data[0x36] = local_30._6_1_;
      zVar2.data[0x37] = local_30._7_1_;
      zVar2.data[0x38] = (undefined1)uStack_28;
      zVar2.data[0x39] = uStack_28._1_1_;
      zVar2.data[0x3a] = uStack_28._2_1_;
      zVar2.data[0x3b] = uStack_28._3_1_;
      zVar2.data[0x3c] = uStack_28._4_1_;
      zVar2.data[0x3d] = uStack_28._5_1_;
      zVar2.data[0x3e] = uStack_28._6_1_;
      zVar2.data[0x3f] = uStack_28._7_1_;
      hContext_local._4_4_ = (*p_Var1)((ze_context_handle_t)p_Var3,zVar2);
    }
  }
  else {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hContext_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeMemPutIpcHandle(
    ze_context_handle_t hContext,                   ///< [in] handle of the context object
    ze_ipc_mem_handle_t handle                      ///< [in] IPC memory handle
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnMemPutIpcHandle_t pfnPutIpcHandle = [&result] {
        auto pfnPutIpcHandle = ze_lib::context->zeDdiTable.load()->Mem.pfnPutIpcHandle;
        if( nullptr == pfnPutIpcHandle ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnPutIpcHandle;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnPutIpcHandle( hContext, handle );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnPutIpcHandle = ze_lib::context->zeDdiTable.load()->Mem.pfnPutIpcHandle;
    if( nullptr == pfnPutIpcHandle ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnPutIpcHandle( hContext, handle );
    #endif
}